

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

ON_2dVector __thiscall ON_Xform::operator*(ON_Xform *this,ON_2dVector *v)

{
  double *m;
  double xh [2];
  double y;
  double x;
  ON_2dVector *v_local;
  ON_Xform *this_local;
  
  ON_2dVector::ON_2dVector
            ((ON_2dVector *)&this_local,this->m_xform[0][0] * v->x + this->m_xform[0][1] * v->y,
             this->m_xform[1][0] * v->x + this->m_xform[1][1] * v->y);
  return _this_local;
}

Assistant:

ON_2dVector ON_Xform::operator*( const ON_2dVector& v ) const
{
  // Note well: The right hand column and bottom row have an important effect 
  // when transforming a Euclidean point and have no effect when transforming a vector. 
  // Be sure you understand the differences between vectors and points when applying a 4x4 transformation.
  const double x = v.x; // optimizer should put x,y in registers
  const double y = v.y;
  double xh[2];
  const double* m = &m_xform[0][0];
  xh[0] = m[0]*x + m[1]*y;
  xh[1] = m[4]*x + m[5]*y;
  return ON_2dVector( xh[0],xh[1] );
}